

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_cleanup(archive_read *a)

{
  void *__ptr;
  char *pcVar1;
  int iVar2;
  archive *in_RDI;
  int r;
  iso9660 *unaff_retaddr;
  iso9660 *iso9660;
  int local_14;
  
  local_14 = 0;
  __ptr = *(void **)in_RDI[0x15].archive_format_name;
  release_files(unaff_retaddr);
  free(*(void **)((long)__ptr + 0x38));
  archive_string_free((archive_string *)0x14af2b);
  archive_string_free((archive_string *)0x14af39);
  if (*(long *)((long)__ptr + 0x70) != 0) {
    free(*(void **)((long)__ptr + 0x70));
  }
  free(*(void **)((long)__ptr + 0x100));
  free(*(void **)((long)__ptr + 0x138));
  if ((*(int *)((long)__ptr + 0x1d8) != 0) && (iVar2 = inflateEnd((long)__ptr + 0x168), iVar2 != 0))
  {
    archive_set_error(in_RDI,-1,"Failed to clean up zlib decompressor");
    local_14 = -0x1e;
  }
  free(*(void **)((long)__ptr + 0x1f0));
  free(*(void **)((long)__ptr + 0x200));
  free(__ptr);
  pcVar1 = in_RDI[0x15].archive_format_name;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  return local_14;
}

Assistant:

static int
archive_read_format_iso9660_cleanup(struct archive_read *a)
{
	struct iso9660 *iso9660;
	int r = ARCHIVE_OK;

	iso9660 = (struct iso9660 *)(a->format->data);
	release_files(iso9660);
	free(iso9660->read_ce_req.reqs);
	archive_string_free(&iso9660->pathname);
	archive_string_free(&iso9660->previous_pathname);
	if (iso9660->pending_files.files)
		free(iso9660->pending_files.files);
#ifdef HAVE_ZLIB_H
	free(iso9660->entry_zisofs.uncompressed_buffer);
	free(iso9660->entry_zisofs.block_pointers);
	if (iso9660->entry_zisofs.stream_valid) {
		if (inflateEnd(&iso9660->entry_zisofs.stream) != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Failed to clean up zlib decompressor");
			r = ARCHIVE_FATAL;
		}
	}
#endif
	free(iso9660->utf16be_path);
	free(iso9660->utf16be_previous_path);
	free(iso9660);
	(a->format->data) = NULL;
	return (r);
}